

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

double __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  double *pdVar1;
  double dVar2;
  
  (this->super_BinaryReaderBase).super_ReaderBase.token_ =
       (this->super_BinaryReaderBase).super_ReaderBase.ptr_;
  pdVar1 = (double *)BinaryReaderBase::Read(&this->super_BinaryReaderBase,8);
  dVar2 = EndiannessConverter::Convert<double>((EndiannessConverter *)this,*pdVar1);
  return dVar2;
}

Assistant:

double ReadDouble() {
    token_ = ptr_;
    double val;
    memcpy(&val, Read(sizeof(double)), sizeof(double));
    return this->Convert(val);
  }